

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

bool ON_EvaluateQuotientRule(int dim,int der_count,int v_stride,double *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double *pdVar9;
  int iVar10;
  long lVar11;
  double *pdVar12;
  double *pdVar13;
  ulong uVar14;
  bool bVar15;
  double dVar16;
  
  lVar5 = (long)dim;
  dVar1 = v[lVar5];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    for (lVar11 = 0; (der_count + 1U) * v_stride != (int)lVar11; lVar11 = lVar11 + 1) {
      v[lVar11] = v[lVar11] * (1.0 / dVar1);
    }
    if (der_count != 0) {
      lVar11 = (long)v_stride;
      pdVar13 = v + lVar11;
      dVar2 = pdVar13[lVar5];
      pdVar9 = v;
      iVar10 = dim;
      while (bVar15 = iVar10 != 0, iVar10 = iVar10 + -1, bVar15) {
        pdVar9[lVar11] = *pdVar9 * -dVar2 + pdVar9[lVar11];
        pdVar9 = pdVar9 + 1;
      }
      if (1 < der_count) {
        pdVar9 = pdVar13 + lVar11;
        dVar16 = pdVar9[lVar5];
        iVar10 = dim;
        while (bVar15 = iVar10 != 0, iVar10 = iVar10 + -1, bVar15) {
          dVar3 = *pdVar13;
          pdVar13 = pdVar13 + 1;
          dVar4 = *v;
          v = v + 1;
          *pdVar9 = dVar4 * -dVar16 + dVar3 * dVar2 * -2.0 + *pdVar9;
          pdVar9 = pdVar9 + 1;
        }
        if (der_count != 2) {
          pdVar13 = v + -lVar5 + v_stride * 2;
          for (uVar14 = 3; uVar14 != der_count + 1U; uVar14 = uVar14 + 1) {
            pdVar13 = pdVar13 + lVar11;
            pdVar9 = v + uVar14 * lVar11;
            uVar8 = 0;
            pdVar12 = v + -lVar5;
            while (iVar10 = (int)uVar8, uVar14 != uVar8) {
              dVar16 = ON_BinomialCoefficient((int)uVar14 - iVar10,iVar10);
              dVar2 = *pdVar9;
              lVar6 = lVar5 * 8;
              for (lVar7 = 0; dim != (int)lVar7; lVar7 = lVar7 + 1) {
                pdVar13[lVar7] = pdVar12[lVar7] * -dVar16 * dVar2 + pdVar13[lVar7];
                lVar6 = lVar6 + -8;
              }
              pdVar9 = pdVar9 + -lVar11;
              pdVar13 = (double *)((long)pdVar13 - lVar6);
              pdVar12 = (double *)((long)pdVar12 + (lVar11 * 8 - lVar6));
              uVar8 = (ulong)(iVar10 + 1);
            }
          }
        }
      }
    }
  }
  return (bool)(-(dVar1 != 0.0) & 1);
}

Assistant:

bool ON_EvaluateQuotientRule( int dim, int der_count, int v_stride, double *v )
{
  /*
  The quotient rule says the n-th derivative is

            (n)       (n)          (n)             (n-1)    (1)              (1)    (n-1)
          f  (t) =  x   (t)  -  (w  (t)*f(t) + n*w    (t)*f  (t) + ... + n*w  (t)*f    (t))
                    ---------------------------------------------------------------------
                                             w(t)


                                                                        (i)   (j)
         (The missing summands look like  ON_BinomialCoefficient(i,j)*w   * f    )
  */

  double
    wt, w2, *f, *x, *w;
  int
    i, j, n, df;

  wt = v[dim];
  if (wt == 0.0)
    return false;
  wt = 1.0/wt;
  i = (der_count+1)*v_stride;
  x = v;
  while(i--) *x++ *= wt;

  if (der_count) {
    // 1rst derivative - faster special case 
    f = v;            // f = func(t)
    x = v + v_stride; // x = numerator'(t)/w
    wt = -x[dim];     // wt = -denominator'(t)/w
    j = dim; while (j--) *x++ +=  wt* *f++;
    if (der_count> 1) {
      // 2nd derivative - faster special case 
      f = v + v_stride;
      x = f + v_stride;
      // v = func(t), f = func'(t), x = numerator''(t)/w, 
      // * wt = -2*denominator'(t)/w, w2 = denominator''(t)/w
      wt *= 2.0;
      w2 = -x[dim];
      j = dim; while(j--) *x++ += w2* *v++ + wt* *f++;
      if (der_count>2) {
        df = v_stride-dim;
        // higher derivatives use slower loop
        v -= dim;
        x = v + v_stride*2;
        for (n = 3; n <= der_count; n++) {
          // computing n-th derivative
          f = v;
          x += v_stride; // x = numerator^(n)/weight 
          w = v + n*v_stride + dim;
          for (i = 0; i < n; i++) {
            // f = value of i-th derivative 
            // w = ((n-i)-th derivative of denominator)/weight
            wt = -ON_BinomialCoefficient(n-i,i) * *w;
            w -= v_stride;
            j = dim; while (j--) *x++ += *f++ * wt;
            x -= dim;
            f += df;
          }
        }
      }
    }
  }

  return true;
}